

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcTriangleFans.h
# Opt level: O1

O3DGCErrorCode __thiscall o3dgc::TriangleFans::AddVertex(TriangleFans *this,long vertex)

{
  ulong uVar1;
  long *__src;
  long *__dest;
  ulong uVar2;
  
  if (this->m_numTFANs < 0) {
    __assert_fail("m_numTFANs >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xda,"O3DGCErrorCode o3dgc::TriangleFans::AddVertex(long)");
  }
  if (this->m_numTFANs < this->m_sizeTFANAllocatedSize) {
    if (-1 < this->m_numVertices) {
      uVar2 = this->m_numVertices + 1;
      this->m_numVertices = uVar2;
      uVar1 = this->m_verticesAllocatedSize;
      if (uVar2 == uVar1) {
        this->m_verticesAllocatedSize = uVar1 * 2;
        __src = this->m_vertices;
        __dest = (long *)operator_new__(-(ulong)(uVar1 >> 0x3c != 0) | uVar1 << 4);
        this->m_vertices = __dest;
        memcpy(__dest,__src,uVar2 * 8);
        if (__src != (long *)0x0) {
          operator_delete__(__src);
        }
      }
      this->m_vertices[this->m_numVertices + -1] = vertex;
      this->m_sizeTFAN[this->m_numTFANs + -1] = this->m_sizeTFAN[this->m_numTFANs + -1] + 1;
      return O3DGC_OK;
    }
    __assert_fail("m_numVertices >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                  ,0xdc,"O3DGCErrorCode o3dgc::TriangleFans::AddVertex(long)");
  }
  __assert_fail("m_numTFANs < m_sizeTFANAllocatedSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcTriangleFans.h"
                ,0xdb,"O3DGCErrorCode o3dgc::TriangleFans::AddVertex(long)");
}

Assistant:

O3DGCErrorCode                AddVertex(long vertex) 
                                    {
                                        assert(m_numTFANs    >= 0);
                                        assert(m_numTFANs    <  m_sizeTFANAllocatedSize);
                                        assert(m_numVertices >= 0);
                                        ++m_numVertices;
                                        if (m_numVertices == m_verticesAllocatedSize)
                                        {
                                            m_verticesAllocatedSize *= 2;
                                            long * tmp = m_vertices;
                                            m_vertices = new long [m_verticesAllocatedSize];
                                            memcpy(m_vertices, tmp, sizeof(long) * m_numVertices);
                                            delete [] tmp;
                                        }
                                        m_vertices[m_numVertices-1] = vertex;
                                        ++m_sizeTFAN[m_numTFANs-1];
                                        return O3DGC_OK;
                                    }